

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptUtils.cpp
# Opt level: O1

bool getBoolOrCrash(Object *object)

{
  uint uVar1;
  long lVar2;
  runtime_error *this;
  
  do {
    if (object == (Object *)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"ScriptUtils::getBoolOrCrash => object is null!");
LAB_00105458:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = (**object->_vptr_Object)(object);
    if ((char)uVar1 != '\x02') {
      if ((uVar1 & 0xff) == 1) {
        lVar2 = __dynamic_cast(object,&Object::typeinfo,&ObjectBool::typeinfo,0);
        return (bool)*(undefined1 *)(lVar2 + 8);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"ScriptUtils::getBoolOrCrash => wrong type!");
      goto LAB_00105458;
    }
    lVar2 = __dynamic_cast(object,&Object::typeinfo,&Variable::typeinfo,0);
    object = *(Object **)(lVar2 + 8);
  } while( true );
}

Assistant:

bool getBoolOrCrash(Object* object) {
	if (object == nullptr) {
		throw std::runtime_error("ScriptUtils::getBoolOrCrash => object is null!");
	}
	ObjectType type = object->getType();
	if (type == OT_BOOL) {
		auto *objectBool = dynamic_cast<ObjectBool *>(object);
		return objectBool->value;
	} else if (type == OT_VARIABLE) {
		auto *objectVariable = dynamic_cast<Variable *>(object);
		return getBoolOrCrash(objectVariable->value);
	} else {
		throw std::runtime_error("ScriptUtils::getBoolOrCrash => wrong type!");
	}
}